

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void add_stone_to_lookup(event_path_data evp,int stone_num,int global_stone_num)

{
  void *pvVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int base;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = *(int *)(in_RDI + 0x10);
  if (*(int *)(in_RDI + 0x10) == 0) {
    pvVar1 = INT_CMmalloc(CONCAT44(in_ESI,in_EDX));
    *(void **)(in_RDI + 0x18) = pvVar1;
  }
  else {
    pvVar1 = INT_CMrealloc((void *)CONCAT44(in_ESI,in_EDX),CONCAT44(iVar2,in_stack_ffffffffffffffe8)
                          );
    *(void **)(in_RDI + 0x18) = pvVar1;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)iVar2 * 8) = in_EDX;
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4 + (long)iVar2 * 8) = in_ESI;
  *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  return;
}

Assistant:

extern void
add_stone_to_lookup(event_path_data evp, int stone_num, int global_stone_num)
{
    int base = evp->stone_lookup_table_size;
    if (evp->stone_lookup_table_size == 0) {
	evp->stone_lookup_table = 
	    malloc(sizeof(evp->stone_lookup_table[0]));
    } else {
	evp->stone_lookup_table = 
	    realloc(evp->stone_lookup_table,
		    sizeof(evp->stone_lookup_table[0]) * (1+base));
    }
    evp->stone_lookup_table[base].global_id = global_stone_num;
    evp->stone_lookup_table[base].local_id = stone_num;
    evp->stone_lookup_table_size++;
}